

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::SideIsUndefined
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,int side)

{
  int iVar1;
  long *plVar2;
  
  if (-1 < side) {
    iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0xf0))(this);
    if (side <= iVar1) {
      return (int)(this->fNeighbours[side].fGeoElIndex == -1 || this->fNeighbours[side].fSide == -1)
      ;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZGeoElRefLess<TGeo>::SideIsUndefined - bad side: ",0x33);
  plVar2 = (long *)std::ostream::operator<<(&std::cerr,side);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
             ,0xcd);
}

Assistant:

int
TPZGeoElRefLess<TGeo>::SideIsUndefined(int side){
	if (side < 0 || side > NSides()){
		PZError << "TPZGeoElRefLess<TGeo>::SideIsUndefined - bad side: " << side << std::endl;
        DebugStop();
	}
	return (fNeighbours[side].Side() == -1);
}